

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

pair<unsigned_int,_unsigned_int>
kratos::compute_var_high_low
          (Var *root,
          vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          *index)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  pointer ppVar4;
  pointer ppVar5;
  pair<unsigned_int,_unsigned_int> pVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  undefined1 local_50 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> bases;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
             (long)(root->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(root->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 2,
             (allocator_type *)
             ((long)&bases.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  puVar3 = (root->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = (long)(root->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2;
  iVar9 = 1;
  for (uVar8 = uVar7 & 0xffffffff; 0 < (int)uVar8; uVar8 = uVar8 - 1) {
    *(uint32_t *)((long)local_50 + (uVar8 - 1) * 4) = root->var_width_ * iVar9;
    iVar9 = iVar9 * puVar3[uVar8 - 1];
  }
  ppVar4 = (index->
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar8 = (long)(index->
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4 >> 3;
  uVar14 = 0;
  uVar15 = 0;
  uVar10 = 0;
  uVar11 = 0;
  do {
    if (uVar8 == uVar10) {
LAB_001ba15d:
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
      pVar6.second = uVar14;
      pVar6.first = uVar15;
      return pVar6;
    }
    uVar1 = ppVar4[uVar10].first;
    uVar2 = ppVar4[uVar10].second;
    uVar13 = (ulong)uVar11;
    iVar9 = uVar1 - uVar2;
    if (uVar1 < uVar2 || iVar9 == 0) {
      if (((iVar9 != 0) || (uVar7 <= uVar13)) || (puVar3[uVar13] < 2)) {
        if (uVar10 < uVar8) {
          for (; uVar10 < uVar8; uVar10 = uVar10 + 1) {
            ppVar5 = ppVar4 + uVar10;
            uVar15 = uVar14 + ppVar4[uVar10].first;
            uVar14 = ppVar5->second + uVar14;
          }
        }
        goto LAB_001ba15d;
      }
      uVar14 = uVar14 + uVar1 * *(pointer)((long)local_50 + uVar13 * 4);
      iVar9 = *(pointer)((long)local_50 + uVar13 * 4) + uVar14;
      uVar11 = uVar11 + 1;
    }
    else {
      iVar12 = root->var_width_ * *(pointer)((long)local_50 + uVar13 * 4);
      uVar14 = uVar14 + uVar2 * iVar12;
      iVar9 = (iVar9 + 1) * iVar12 + uVar14;
    }
    uVar15 = iVar9 - 1;
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

std::pair<uint32_t, uint32_t> compute_var_high_low(
    const Var *root, const std::vector<std::pair<uint32_t, uint32_t>> &index) {
    // outer to inner
    // flatten the index
    auto const &var_sizes = root->size();
    std::vector<uint32_t> bases(var_sizes.size());
    uint32_t base = 1;
    for (int i = static_cast<int>(var_sizes.size()) - 1; i >= 0; i--) {
        bases[i] = base * root->var_width();
        base *= var_sizes[i];
    }

    uint32_t var_low = 0;
    uint32_t var_high = 0;
    uint32_t index_to_size = 0;
    uint64_t i = 0;
    while (i < index.size()) {
        auto const &[slice_high, slice_low] = index[i];
        if (slice_high > slice_low) {
            var_low += slice_low * bases[index_to_size] * root->var_width();
            var_high = var_low +
                       (slice_high - slice_low + 1) * bases[index_to_size] * root->var_width() - 1;
        } else if (slice_high == slice_low && index_to_size < var_sizes.size() &&
                   var_sizes[index_to_size] > 1) {
            var_low += slice_low * bases[index_to_size];
            var_high = var_low + (slice_high - slice_low + 1) * bases[index_to_size] - 1;
            index_to_size++;
        } else {
            break;
        }
        i++;
    }

    if (i < index.size()) {
        for (; i < index.size(); i++) {
            auto const &[slice_high, slice_low] = index[i];
            var_low += slice_low;
            var_high = var_low + (slice_high - slice_low);
        }
    }

    return {var_high, var_low};
}